

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  bool bVar1;
  OutputInfo *pOVar2;
  size_type sVar3;
  pointer pcVar4;
  string local_40;
  
  bVar1 = cmTarget::IsImported(this->Target);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&local_40,this->Target,config,artifact);
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  pOVar2 = GetOutputInfo(this,config);
  if (pOVar2 == (OutputInfo *)0x0) {
LAB_002e8adb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (artifact == ImportLibraryArtifact) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pOVar2->ImpDir)._M_dataplus._M_p;
      sVar3 = (pOVar2->ImpDir)._M_string_length;
    }
    else {
      if (artifact != RuntimeBinaryArtifact) goto LAB_002e8adb;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pOVar2->OutDir)._M_dataplus._M_p;
      sVar3 = (pOVar2->OutDir)._M_string_length;
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    // Return the directory from which the target is imported.
    return cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, artifact));
  }
  if (OutputInfo const* info = this->GetOutputInfo(config)) {
    // Return the directory in which the target will be built.
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        return info->OutDir;
      case cmStateEnums::ImportLibraryArtifact:
        return info->ImpDir;
    }
  }
  return "";
}